

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.h
# Opt level: O2

void __thiscall
slang::ast::MinTypMaxExpression::visitExprs<CollectLHSSymbols&>
          (MinTypMaxExpression *this,AlwaysFFVisitor *visitor)

{
  Expression::visit<CollectLHSSymbols&>(this->min_,visitor);
  Expression::visit<CollectLHSSymbols&>(this->typ_,visitor);
  Expression::visit<CollectLHSSymbols&>(this->max_,visitor);
  return;
}

Assistant:

decltype(auto) visitExprs(TVisitor&& visitor) const {
        min().visit(visitor);
        typ().visit(visitor);
        max().visit(visitor);
    }